

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool FBehavior::StaticCheckAllGood(void)

{
  bool bVar1;
  uint uVar2;
  FBehavior **ppFVar3;
  uint local_10;
  uint i;
  
  local_10 = 0;
  while( true ) {
    uVar2 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
    if (uVar2 <= local_10) {
      return true;
    }
    ppFVar3 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)local_10);
    bVar1 = IsGood(*ppFVar3);
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  return false;
}

Assistant:

bool FBehavior::StaticCheckAllGood ()
{
	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (!StaticModules[i]->IsGood())
		{
			return false;
		}
	}
	return true;
}